

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O3

MatrixDynSize * __thiscall
iDynTree::MatrixDynSize::operator=(MatrixDynSize *this,MatrixView<const_double> *other)

{
  MatrixStorageOrdering MVar1;
  size_t sVar2;
  pointer peVar3;
  long lVar4;
  size_t sVar5;
  double *pdVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  
  sVar11 = other->m_rows;
  this->m_rows = sVar11;
  sVar2 = other->m_cols;
  this->m_cols = sVar2;
  uVar9 = sVar2 * sVar11;
  if (uVar9 != 0) {
    if (this->m_capacity < uVar9) {
      if ((this->m_capacity != 0) && (this->m_data != (double *)0x0)) {
        operator_delete__(this->m_data);
        sVar11 = this->m_rows;
      }
      pdVar6 = (double *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8);
      this->m_data = pdVar6;
      this->m_capacity = uVar9;
    }
    if (sVar11 != 0) {
      pdVar6 = this->m_data;
      sVar2 = this->m_cols;
      sVar7 = 0;
      do {
        if (sVar2 != 0) {
          peVar3 = other->m_storage;
          MVar1 = other->m_storageOrder;
          lVar4 = other->m_outerStride;
          sVar8 = 0;
          do {
            sVar10 = sVar7;
            sVar5 = sVar8;
            if (MVar1 == RowMajor) {
              sVar10 = sVar8;
              sVar5 = sVar7;
            }
            pdVar6[sVar8] = peVar3[sVar5 * lVar4 + sVar10];
            sVar8 = sVar8 + 1;
          } while (sVar2 != sVar8);
        }
        sVar7 = sVar7 + 1;
        pdVar6 = pdVar6 + sVar2;
      } while (sVar7 != sVar11);
    }
  }
  return this;
}

Assistant:

MatrixDynSize& MatrixDynSize::operator=(MatrixView<const double> other)
{
    m_rows = other.rows();
    m_cols = other.cols();

    const std::size_t requiredCapacity = m_rows * m_cols;

    // if other is empty, return
    if (requiredCapacity == 0) return  *this;

    // If the copied data fits in the currently allocated buffer,
    // use that one (if the user want to free the memory can use
    // the shrink_to_fit method).
    // Otherwise, allocate a new buffer after deleting the old one)
    if (m_capacity < requiredCapacity) {
        // need to allocate new buffer
        // if old buffer exists, delete it
        if (m_capacity > 0) {
            delete [] m_data;
        }
        m_data = new double[requiredCapacity];
        m_capacity = requiredCapacity;
    }

    for(std::size_t i = 0; i < m_rows; i++)
    {
        for(std::size_t j = 0; j < m_cols; j++)
        {
            this->m_data[this->rawIndexRowMajor(i,j)] = other(i, j);
        }
    }

    return *this;
}